

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::AlphaToCoverageTest::createMultisampleTestInstance
          (AlphaToCoverageTest *this,Context *context,VkPrimitiveTopology topology,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices,
          VkPipelineMultisampleStateCreateInfo *multisampleStateParams,
          VkPipelineColorBlendAttachmentState *colorBlendState)

{
  GeometryType GVar1;
  Context *pCVar2;
  _func_int **pp_Var3;
  Context *pCVar4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  TestInstance *pTVar7;
  
  pTVar7 = (TestInstance *)operator_new(0x90);
  GVar1 = this->m_geometryType;
  pTVar7->m_context = context;
  pTVar7->_vptr_TestInstance = (_func_int **)&PTR__AlphaToCoverageInstance_00d28bc0;
  pTVar7[1]._vptr_TestInstance = (_func_int **)0x2000000025;
  *(undefined4 *)&pTVar7[1].m_context = 0x20;
  *(VkPrimitiveTopology *)((long)&pTVar7[1].m_context + 4) = topology;
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             (pTVar7 + 2),vertices);
  pCVar2 = *(Context **)multisampleStateParams;
  pp_Var3 = (_func_int **)multisampleStateParams->pNext;
  pCVar4 = *(Context **)&multisampleStateParams->flags;
  pp_Var5 = *(_func_int ***)&multisampleStateParams->sampleShadingEnable;
  pp_Var6 = *(_func_int ***)&multisampleStateParams->alphaToCoverageEnable;
  pTVar7[5].m_context = (Context *)multisampleStateParams->pSampleMask;
  pTVar7[6]._vptr_TestInstance = pp_Var6;
  pTVar7[4].m_context = pCVar4;
  pTVar7[5]._vptr_TestInstance = pp_Var5;
  pTVar7[3].m_context = pCVar2;
  pTVar7[4]._vptr_TestInstance = pp_Var3;
  pp_Var3 = *(_func_int ***)&colorBlendState->dstColorBlendFactor;
  pCVar2 = *(Context **)&colorBlendState->srcAlphaBlendFactor;
  pp_Var5 = *(_func_int ***)&colorBlendState->alphaBlendOp;
  pTVar7[6].m_context = *(Context **)colorBlendState;
  pTVar7[7]._vptr_TestInstance = pp_Var3;
  pTVar7[7].m_context = pCVar2;
  pTVar7[8]._vptr_TestInstance = pp_Var5;
  *(GeometryType *)&pTVar7[8].m_context = GVar1;
  return pTVar7;
}

Assistant:

TestInstance* AlphaToCoverageTest::createMultisampleTestInstance (Context&										context,
																  VkPrimitiveTopology							topology,
																  const std::vector<Vertex4RGBA>&				vertices,
																  const VkPipelineMultisampleStateCreateInfo&	multisampleStateParams,
																  const VkPipelineColorBlendAttachmentState&	colorBlendState) const
{
	return new AlphaToCoverageInstance(context, topology, vertices, multisampleStateParams, colorBlendState, m_geometryType);
}